

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O0

string * format(string *__return_storage_ptr__,string *fmt,string *arg1,double arg2)

{
  allocator<char> local_f1;
  string local_f0;
  string local_d0;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  undefined1 local_29;
  double local_28;
  double arg2_local;
  string *arg1_local;
  string *fmt_local;
  string *output;
  
  local_29 = 0;
  local_28 = arg2;
  arg2_local = (double)arg1;
  arg1_local = fmt;
  fmt_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)fmt);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"{1}",&local_51);
  replace_positional(__return_storage_ptr__,&local_50,(string *)arg2_local);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"{2}",&local_89);
  format_abi_cxx11_(&local_d0,local_28,6,3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0," ",&local_f1);
  trim(&local_b0,&local_d0,&local_f0);
  replace_positional(__return_storage_ptr__,&local_88,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  return __return_storage_ptr__;
}

Assistant:

const std::string format (
  const std::string& fmt,
  const std::string& arg1,
  double arg2)
{
  std::string output = fmt;
  replace_positional (output, "{1}", arg1);
  replace_positional (output, "{2}", trim (format (arg2, 6, 3)));
  return output;
}